

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O0

Material * __thiscall Assimp::D3DS::Material::operator=(Material *this,Material *other)

{
  Material *other_local;
  Material *this_local;
  
  if (this != other) {
    std::__cxx11::string::operator=((string *)&this->mName,(string *)&other->mName);
    aiColor3D::operator=(&this->mDiffuse,&other->mDiffuse);
    this->mSpecularExponent = other->mSpecularExponent;
    this->mShininessStrength = other->mShininessStrength;
    aiColor3D::operator=(&this->mSpecular,&other->mSpecular);
    aiColor3D::operator=(&this->mAmbient,&other->mAmbient);
    this->mShading = other->mShading;
    this->mTransparency = other->mTransparency;
    Texture::operator=(&this->sTexDiffuse,&other->sTexDiffuse);
    Texture::operator=(&this->sTexOpacity,&other->sTexOpacity);
    Texture::operator=(&this->sTexSpecular,&other->sTexSpecular);
    Texture::operator=(&this->sTexReflective,&other->sTexReflective);
    Texture::operator=(&this->sTexBump,&other->sTexBump);
    Texture::operator=(&this->sTexEmissive,&other->sTexEmissive);
    Texture::operator=(&this->sTexShininess,&other->sTexShininess);
    this->mBumpHeight = other->mBumpHeight;
    aiColor3D::operator=(&this->mEmissive,&other->mEmissive);
    Texture::operator=(&this->sTexAmbient,&other->sTexAmbient);
    this->mTwoSided = (bool)(other->mTwoSided & 1);
  }
  return this;
}

Assistant:

Material &operator=(Material &&other) AI_NO_EXCEPT {
        if (this == &other) {
            return *this;
        }

        mName = std::move(other.mName);
        mDiffuse = std::move(other.mDiffuse);
        mSpecularExponent = std::move(other.mSpecularExponent);
        mShininessStrength = std::move(other.mShininessStrength),
        mSpecular = std::move(other.mSpecular);
        mAmbient = std::move(other.mAmbient);
        mShading = std::move(other.mShading);
        mTransparency = std::move(other.mTransparency);
        sTexDiffuse = std::move(other.sTexDiffuse);
        sTexOpacity = std::move(other.sTexOpacity);
        sTexSpecular = std::move(other.sTexSpecular);
        sTexReflective = std::move(other.sTexReflective);
        sTexBump = std::move(other.sTexBump);
        sTexEmissive = std::move(other.sTexEmissive);
        sTexShininess = std::move(other.sTexShininess);
        mBumpHeight = std::move(other.mBumpHeight);
        mEmissive = std::move(other.mEmissive);
        sTexAmbient = std::move(other.sTexAmbient);
        mTwoSided = std::move(other.mTwoSided);

        return *this;
    }